

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::BeginMainMenuBar(void)

{
  undefined8 uVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  bool bVar4;
  ImGuiViewport *pIVar5;
  ImGuiWindow *pIVar6;
  float fVar7;
  ImVec2 menu_bar_pos;
  ImVec2 local_30;
  ImVec2 menu_bar_size;
  
  pIVar2 = GImGui;
  pIVar5 = GetMainViewport();
  pIVar6 = FindWindowByName("##MainMenuBar");
  fVar7 = (pIVar2->Style).DisplaySafeAreaPadding.y - (pIVar2->Style).FramePadding.y;
  (pIVar2->NextWindowData).MenuBarOffsetMinVal.x = (pIVar2->Style).DisplaySafeAreaPadding.x;
  (pIVar2->NextWindowData).MenuBarOffsetMinVal.y = (float)(-(uint)(0.0 <= fVar7) & (uint)fVar7);
  if ((pIVar6 == (ImGuiWindow *)0x0) || (pIVar6->BeginCount == 0)) {
    uVar1 = *(undefined8 *)&pIVar5[4].Size.y;
    fVar7 = (float)uVar1;
    menu_bar_pos.x = (pIVar5->Pos).x + fVar7;
    menu_bar_pos.y = (pIVar5->Pos).y + (float)((ulong)uVar1 >> 0x20);
    menu_bar_size.x = ((pIVar5->Size).x - fVar7) + pIVar5[4].WorkPos.y;
    menu_bar_size.y = 1.0;
    local_30.x = 0.0;
    local_30.y = 0.0;
    SetNextWindowPos(&menu_bar_pos,0,&local_30);
    SetNextWindowSize(&menu_bar_size,0);
  }
  PushStyleVar(2,0.0);
  menu_bar_pos.x = 0.0;
  menu_bar_pos.y = 0.0;
  PushStyleVar(4,&menu_bar_pos);
  bVar4 = false;
  bVar3 = Begin("##MainMenuBar",(bool *)0x0,0x50f);
  if (bVar3) {
    bVar4 = BeginMenuBar();
  }
  PopStyleVar(2);
  pIVar6 = GImGui->CurrentWindow;
  pIVar6->WriteAccessed = true;
  if (pIVar6->BeginCount == 1) {
    pIVar5[4].WorkPos.x = (pIVar6->Size).y + pIVar5[4].WorkPos.x;
  }
  (pIVar2->NextWindowData).MenuBarOffsetMinVal.x = 0.0;
  (pIVar2->NextWindowData).MenuBarOffsetMinVal.y = 0.0;
  if (bVar4 == false) {
    End();
  }
  return bVar4;
}

Assistant:

bool ImGui::BeginMainMenuBar()
{
    ImGuiContext& g = *GImGui;
    ImGuiViewportP* viewport = (ImGuiViewportP*)(void*)GetMainViewport();
    ImGuiWindow* menu_bar_window = FindWindowByName("##MainMenuBar");

    // For the main menu bar, which cannot be moved, we honor g.Style.DisplaySafeAreaPadding to ensure text can be visible on a TV set.
    g.NextWindowData.MenuBarOffsetMinVal = ImVec2(g.Style.DisplaySafeAreaPadding.x, ImMax(g.Style.DisplaySafeAreaPadding.y - g.Style.FramePadding.y, 0.0f));

    // Get our rectangle at the top of the work area
    if (menu_bar_window == NULL || menu_bar_window->BeginCount == 0)
    {
        // Set window position
        // We don't attempt to calculate our height ahead, as it depends on the per-viewport font size. 
        // However menu-bar will affect the minimum window size so we'll get the right height.
        ImVec2 menu_bar_pos = viewport->Pos + viewport->CurrWorkOffsetMin;
        ImVec2 menu_bar_size = ImVec2(viewport->Size.x - viewport->CurrWorkOffsetMin.x + viewport->CurrWorkOffsetMax.x, 1.0f);
        SetNextWindowPos(menu_bar_pos);
        SetNextWindowSize(menu_bar_size);
    }

    // Create window
    PushStyleVar(ImGuiStyleVar_WindowRounding, 0.0f);
    PushStyleVar(ImGuiStyleVar_WindowMinSize, ImVec2(0, 0)); // Lift normal size constraint, however the presence of a menu-bar will give us the minimum height we want.
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoMove | ImGuiWindowFlags_NoScrollbar | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_MenuBar;
    bool is_open = Begin("##MainMenuBar", NULL, window_flags) && BeginMenuBar();
    PopStyleVar(2);

    // Report our size into work area (for next frame) using actual window size
    menu_bar_window = GetCurrentWindow();
    if (menu_bar_window->BeginCount == 1)
        viewport->CurrWorkOffsetMin.y += menu_bar_window->Size.y;

    g.NextWindowData.MenuBarOffsetMinVal = ImVec2(0.0f, 0.0f);
    if (!is_open)
    {
        End();
        return false;
    }
    return true; //-V1020
}